

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketAcceptor::addThread(ThreadedSocketAcceptor *this,socket_handle s,thread_id t)

{
  mapped_type_conflict2 *pmVar1;
  key_type local_24;
  
  Mutex::lock(&this->m_mutex);
  pmVar1 = std::
           map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           ::operator[](&this->m_threads,&local_24);
  *pmVar1 = t;
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void ThreadedSocketAcceptor::addThread(socket_handle s, thread_id t) {
  Locker l(m_mutex);

  m_threads[s] = t;
}